

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O2

void __thiscall glslang::TInputScanner::setFile(TInputScanner *this,char *filename,int i)

{
  TString *pTVar1;
  int iVar2;
  
  pTVar1 = NewPoolTString_abi_cxx11_(filename);
  iVar2 = this->numSources + -1;
  if (this->currentSource <= iVar2) {
    iVar2 = this->currentSource;
  }
  if (iVar2 == i) {
    (this->logicalSourceLoc).name = pTVar1;
  }
  this->loc[i].name = pTVar1;
  return;
}

Assistant:

void setFile(const char* filename, int i)
    {
        TString* fn_tstr = NewPoolTString(filename);
        if (i == getLastValidSourceIndex()) {
            logicalSourceLoc.name = fn_tstr;
        }
        loc[i].name = fn_tstr;
    }